

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O3

void __thiscall CWire::AdjustBoundary(CWire *this,CLayer *pLayer,int iBlocakge)

{
  short sVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  CPoint *pCVar5;
  CPoint *pCVar6;
  CBoundary *pCVar7;
  int i;
  int iX;
  int i_1;
  int iY;
  
  pCVar5 = this->m_pPointE;
  pCVar6 = this->m_pPointS;
  sVar1 = pCVar6->m_iX;
  iX = (int)sVar1;
  sVar2 = pCVar5->m_iX;
  if (sVar2 < sVar1) {
    __assert_fail("m_pPointS->X()<=m_pPointE->X()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x5d6,"void CWire::AdjustBoundary(CLayer *, int)");
  }
  uVar4 = (this->super_CObject).m_iProp;
  if ((uVar4 & 0x20f) == 0) {
    __assert_fail("IsFlat()||IsPoint()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x5d7,"void CWire::AdjustBoundary(CLayer *, int)");
  }
  if ((uVar4 >> 9 & 1) == 0) {
    if ((uVar4 & 5) == 0) {
      if ((uVar4 & 10) != 0) {
        if (sVar1 != sVar2) {
          __assert_fail("m_pPointS->X()==m_pPointE->X()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x5ee,"void CWire::AdjustBoundary(CLayer *, int)");
        }
        iY = (int)pCVar6->m_iY;
        sVar1 = pCVar5->m_iY;
        if (sVar1 <= pCVar6->m_iY) {
          __assert_fail("iMinY<iMaxY",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x5f3,"void CWire::AdjustBoundary(CLayer *, int)");
        }
        do {
          pCVar7 = CLayer::GetBoundary(pLayer,iX,iY);
          CBoundary::AdjustCapacity(pCVar7,iBlocakge);
          iY = iY + 1;
        } while (sVar1 != iY);
      }
    }
    else {
      sVar3 = pCVar6->m_iY;
      if (sVar3 != pCVar5->m_iY) {
        __assert_fail("m_pPointS->Y()==m_pPointE->Y()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x5e2,"void CWire::AdjustBoundary(CLayer *, int)");
      }
      if (sVar2 <= sVar1) {
        __assert_fail("iMinX<iMaxX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x5e8,"void CWire::AdjustBoundary(CLayer *, int)");
      }
      do {
        pCVar7 = CLayer::GetBoundary(pLayer,iX,(int)sVar3);
        CBoundary::AdjustCapacity(pCVar7,iBlocakge);
        iX = iX + 1;
      } while (sVar2 != iX);
    }
  }
  return;
}

Assistant:

void CWire::AdjustBoundary(CLayer* pLayer, int iBlocakge)
{
	// need to have a valid layer [6/18/2006 thyeros]
	assert(m_pPointS->X()<=m_pPointE->X());
	assert(IsFlat()||IsPoint());

	if(IsPoint())	return;

	//////////////////////////////////////////////////////////////////////////
	// congestion and density are updated here [6/28/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	CDesign*	pDesign		=	GetDesign();

	if(IsHorizontal())
	{
		assert(m_pPointS->Y()==m_pPointE->Y());
		int	iY		=	m_pPointS->Y();
		int iMinX	=	m_pPointS->X();
		int	iMaxX	=	m_pPointE->X();

		// the last point doesn't require to update boundary [6/18/2006 thyeros]
		assert(iMinX<iMaxX);

		for (int i=iMinX;i<iMaxX;++i)	pLayer->GetBoundary(i,iY)->AdjustCapacity(iBlocakge);
	}
	else if(IsVertical())
	{
		assert(m_pPointS->X()==m_pPointE->X());
		int	iX		=	m_pPointS->X();
		int iMinY	=	m_pPointS->Y();
		int	iMaxY	=	m_pPointE->Y();

		assert(iMinY<iMaxY);

		for (int i=iMinY;i<iMaxY;++i)	pLayer->GetBoundary(iX,i)->AdjustCapacity(iBlocakge);
	}
}